

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void it_playing_update_resamplers(IT_PLAYING *playing)

{
  IT_PLAYING *playing_local;
  
  if (((playing->sample->flags & 0x20) == 0) || ((playing->flags & 2U) != 0)) {
    if ((playing->sample->flags & 0x10) == 0) {
      if ((playing->flags & 0x10U) == 0) {
        if ((playing->sample->flags & 0x20) == 0) {
          (playing->resampler).start = 0;
        }
        else {
          (playing->resampler).start = playing->sample->sus_loop_start;
        }
        (playing->resampler).end = playing->sample->length;
        (playing->resampler).pickup = it_pickup_stop_at_end;
      }
      else {
        (playing->resampler).start = 0;
        (playing->resampler).end = playing->sample->length;
        (playing->resampler).dir = -1;
        (playing->resampler).pickup = it_pickup_stop_after_reverse;
      }
    }
    else {
      (playing->resampler).start = playing->sample->loop_start;
      (playing->resampler).end = playing->sample->loop_end;
      if ((playing->resampler).start == (playing->resampler).end) {
        (playing->resampler).pickup = it_pickup_stop_at_end;
      }
      else if ((playing->sample->flags & 0x40) == 0) {
        (playing->resampler).pickup = it_pickup_loop;
      }
      else {
        (playing->resampler).pickup = it_pickup_pingpong_loop;
      }
    }
  }
  else {
    (playing->resampler).start = playing->sample->sus_loop_start;
    (playing->resampler).end = playing->sample->sus_loop_end;
    if ((playing->resampler).start == (playing->resampler).end) {
      (playing->resampler).pickup = it_pickup_stop_at_end;
    }
    else if ((playing->sample->flags & 0x80) == 0) {
      (playing->resampler).pickup = it_pickup_loop;
    }
    else {
      (playing->resampler).pickup = it_pickup_pingpong_loop;
    }
  }
  return;
}

Assistant:

static void it_playing_update_resamplers(IT_PLAYING *playing)
{
	if ((playing->sample->flags & IT_SAMPLE_SUS_LOOP) && !(playing->flags & IT_PLAYING_SUSTAINOFF)) {
		playing->resampler.start = playing->sample->sus_loop_start;
		playing->resampler.end = playing->sample->sus_loop_end;
		if (playing->resampler.start == playing->resampler.end)
			playing->resampler.pickup = &it_pickup_stop_at_end;
		else if (playing->sample->flags & IT_SAMPLE_PINGPONG_SUS_LOOP)
			playing->resampler.pickup = &it_pickup_pingpong_loop;
		else
			playing->resampler.pickup = &it_pickup_loop;
	} else if (playing->sample->flags & IT_SAMPLE_LOOP) {
		playing->resampler.start = playing->sample->loop_start;
		playing->resampler.end = playing->sample->loop_end;
		if (playing->resampler.start == playing->resampler.end)
			playing->resampler.pickup = &it_pickup_stop_at_end;
		else if (playing->sample->flags & IT_SAMPLE_PINGPONG_LOOP)
			playing->resampler.pickup = &it_pickup_pingpong_loop;
		else
			playing->resampler.pickup = &it_pickup_loop;
	} else if (playing->flags & IT_PLAYING_REVERSE) {
		playing->resampler.start = 0;
		playing->resampler.end = playing->sample->length;
		playing->resampler.dir = -1;
		playing->resampler.pickup = &it_pickup_stop_after_reverse;
	} else {
		if (playing->sample->flags & IT_SAMPLE_SUS_LOOP)
			playing->resampler.start = playing->sample->sus_loop_start;
		else
			playing->resampler.start = 0;
		playing->resampler.end = playing->sample->length;
		playing->resampler.pickup = &it_pickup_stop_at_end;
	}
	ASSERT(playing->resampler.pickup_data == playing);
}